

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create
               (BenchmarkContext *context)

{
  anon_class_8_1_54a39813 local_90;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58 [35];
  anon_class_1_0_00000001 local_35 [13];
  undefined1 local_28 [8];
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  int64_t n;
  BenchmarkContext *context_local;
  
  s._size = BenchmarkContext::GetIterationsCount(context);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::StorageArray((StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                  *)local_28,s._size);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::Construct((StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
               *)local_28);
  StorageArray<wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>>
  ::
  ForEach<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create(benchmarks::BenchmarkContext&)::_lambda(wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>&)_1_>
            ((StorageArray<wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>>
              *)local_28,local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"signal",&local_59);
  (*context->_vptr_BenchmarkContext[2])(context,local_58,s._size);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"destroy",&local_81);
  local_90.s = (StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                *)local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_80,s._size,&local_90);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::~StorageArray((StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                   *)local_28);
  return;
}

Assistant:

static void Create(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            s.Construct();
            s.ForEach([](SignalType& s){ ConnectionType(s.connect(SignalsDesc_::MakeHandler())); s(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }